

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_aggsig_add_signatures_single
              (secp256k1_context *ctx,uchar *sig64,uchar **sigs,size_t num_sigs,
              secp256k1_pubkey *pubnonce_total)

{
  int iVar1;
  uchar *in_RCX;
  long in_RDX;
  uchar *in_RSI;
  long in_R8;
  int overflow;
  size_t i;
  secp256k1_gej pubnonce_total_j;
  secp256k1_ge noncesum_pt;
  secp256k1_scalar tmp;
  secp256k1_ge final;
  secp256k1_scalar s;
  secp256k1_gej *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  uchar *puVar2;
  secp256k1_scalar *in_stack_fffffffffffffe60;
  secp256k1_gej *in_stack_fffffffffffffe68;
  secp256k1_scalar *in_stack_fffffffffffffe70;
  secp256k1_scalar *in_stack_fffffffffffffe78;
  secp256k1_scalar *in_stack_fffffffffffffe80;
  secp256k1_pubkey *in_stack_fffffffffffffe88;
  secp256k1_ge *in_stack_fffffffffffffe90;
  secp256k1_context *in_stack_fffffffffffffe98;
  secp256k1_ge *in_stack_fffffffffffffea0;
  secp256k1_fe local_a8 [2];
  secp256k1_scalar local_50;
  uchar *local_28;
  uchar *local_18;
  int local_4;
  
  if (in_RSI == (uchar *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               (char *)in_stack_fffffffffffffe48);
    local_4 = 0;
  }
  else if (in_RDX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               (char *)in_stack_fffffffffffffe48);
    local_4 = 0;
  }
  else {
    for (puVar2 = (uchar *)0x0; puVar2 < in_RCX; puVar2 = puVar2 + 1) {
      if (*(long *)(in_RDX + (long)puVar2 * 8) == 0) {
        secp256k1_callback_call
                  ((secp256k1_callback *)
                   CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                   (char *)in_stack_fffffffffffffe48);
        return 0;
      }
    }
    if (in_R8 == 0) {
      secp256k1_callback_call
                ((secp256k1_callback *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50)
                 ,(char *)in_stack_fffffffffffffe48);
      local_4 = 0;
    }
    else {
      local_28 = in_RCX;
      local_18 = in_RSI;
      secp256k1_scalar_set_int(&local_50,0);
      for (puVar2 = (uchar *)0x0; puVar2 < local_28; puVar2 = puVar2 + 1) {
        secp256k1_scalar_set_b32
                  (in_stack_fffffffffffffe60,puVar2,
                   (int *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
        if (in_stack_fffffffffffffe54 != 0) {
          return 0;
        }
        secp256k1_scalar_add
                  (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      }
      secp256k1_gej_set_infinity((secp256k1_gej *)0x1178f1);
      secp256k1_pubkey_load
                (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      secp256k1_gej_add_ge
                ((secp256k1_gej *)pubnonce_total_j.z.n[1],(secp256k1_gej *)pubnonce_total_j.z.n[0],
                 (secp256k1_ge *)pubnonce_total_j.y.n[4]);
      iVar1 = secp256k1_gej_has_quad_y_var(in_stack_fffffffffffffe68);
      if (iVar1 == 0) {
        secp256k1_gej_neg((secp256k1_gej *)
                          CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                          in_stack_fffffffffffffe48);
      }
      secp256k1_ge_set_gej(in_stack_fffffffffffffea0,(secp256k1_gej *)in_stack_fffffffffffffe98);
      secp256k1_fe_normalize_var(local_a8);
      secp256k1_fe_get_b32(local_18,local_a8);
      secp256k1_scalar_get_b32(local_18 + 0x20,&local_50);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int secp256k1_aggsig_add_signatures_single(const secp256k1_context* ctx,
    unsigned char *sig64,
    const unsigned char** sigs,
    size_t num_sigs,
    const secp256k1_pubkey* pubnonce_total) {

    secp256k1_scalar s;
    secp256k1_ge final;
    secp256k1_scalar tmp;
    secp256k1_ge noncesum_pt;
    secp256k1_gej pubnonce_total_j;
    size_t i;
    int overflow;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(sigs != NULL);
    for (i=0;i<num_sigs;i++) ARG_CHECK(sigs[i] != NULL);
    ARG_CHECK(pubnonce_total != NULL);
    (void) ctx;

    /* Add signature portions together */
    secp256k1_scalar_set_int(&s, 0);
    for (i = 0; i < num_sigs; i++){
        secp256k1_scalar_set_b32(&tmp, sigs[i] + 32, &overflow);
        if (overflow) {
            return 0;
        }
        secp256k1_scalar_add(&s, &s, &tmp);
    }

    /* nonces should already be totalled */
    secp256k1_gej_set_infinity(&pubnonce_total_j);
    secp256k1_pubkey_load(ctx, &noncesum_pt, pubnonce_total);
    secp256k1_gej_add_ge(&pubnonce_total_j, &pubnonce_total_j, &noncesum_pt);
    if (!secp256k1_gej_has_quad_y_var(&pubnonce_total_j)) {
        secp256k1_gej_neg(&pubnonce_total_j, &pubnonce_total_j);
    }

    secp256k1_ge_set_gej(&final, &pubnonce_total_j);
    secp256k1_fe_normalize_var(&final.x);
    secp256k1_fe_get_b32(sig64, &final.x);
    secp256k1_scalar_get_b32(sig64 + 32, &s);
    return 1;
}